

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_groups.cxx
# Opt level: O3

void __thiscall xray_re::xr_group_object::save(xr_group_object *this,xr_writer *w)

{
  pointer pbVar1;
  undefined8 in_RAX;
  pointer value;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  xr_custom_object::save(&this->super_xr_custom_object,w);
  xr_writer::w_raw_chunk(w,0,&GROUPOBJ_VERSION,2,false);
  xr_writer::w_raw_chunk(w,3,&(this->super_xr_custom_object).field_0x6c,4,false);
  if (((this->super_xr_custom_object).field_0x6c & 1) == 0) {
    xr_scene::save_objects((this->super_xr_custom_object).m_scene,w,1,&this->m_objects);
  }
  else {
    xr_writer::open_chunk(w,5);
    uStack_28 = CONCAT44((int)((ulong)((long)(this->m_open_objects).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->m_open_objects).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 5),
                         (undefined4)uStack_28);
    (*w->_vptr_xr_writer[2])(w,(long)&uStack_28 + 4,4);
    pbVar1 = (this->m_open_objects).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (value = (this->m_open_objects).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; value != pbVar1; value = value + 1) {
      xr_writer::w_sz(w,value);
    }
    xr_writer::close_chunk(w);
  }
  xr_writer::open_chunk(w,4);
  xr_writer::w_sz(w,&this->m_reference);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_group_object::save(xr_writer& w) const
{
	xr_custom_object::save(w);
	w.w_chunk<uint16_t>(GROUPOBJ_CHUNK_VERSION, GROUPOBJ_VERSION);
	w.w_chunk<uint32_t>(GROUPOBJ_CHUNK_FLAGS, m_flags);
	if (m_flags & GOF_OPEN) {
		w.open_chunk(GROUPOBJ_CHUNK_OPEN_OBJECT_LIST);
		w.w_size_u32(m_open_objects.size());
		w.w_seq(m_open_objects, xr_writer::f_w_sz());
		w.close_chunk();
	} else {
		scene().save_objects(w, GROUPOBJ_CHUNK_OBJECTS, m_objects);
	}
	w.w_chunk(GROUPOBJ_CHUNK_REFERENCE, m_reference);
}